

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  UninterpretedOption *pUVar1;
  DescriptorPool *pDVar2;
  double value;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 aVar3;
  bool bVar4;
  EnumDescriptor *this_00;
  DescriptorPool *pDVar5;
  Symbol SVar6;
  undefined8 *puVar7;
  Type type;
  code *pcVar8;
  ulong uVar9;
  uint64_t uVar10;
  byte unaff_BPL;
  int iVar11;
  char *pcVar12;
  float value_00;
  string_view name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view name_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view value_01;
  FieldDescriptor *option_field_local;
  allocator<char> local_71;
  string fully_qualified_name;
  EnumDescriptor *enum_type;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  FieldDescriptor **local_38;
  
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4) - 1U)
  goto LAB_00143226;
  type = (Type)option_field->type_;
  option_field_local = option_field;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4)) {
  case 1:
    pUVar1 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar1->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar1->field_0 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
        pcVar8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__2,std::__cxx11::string>
        ;
      }
      else {
        uVar9 = (pUVar1->field_0)._impl_.negative_int_value_;
        if (-0x80000001 < (long)uVar9) goto LAB_00143110;
        pcVar8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
        ;
      }
    }
    else {
      uVar9 = (pUVar1->field_0)._impl_.positive_int_value_;
      if ((uVar9 & 0xffffffff80000000) == 0) {
LAB_00143110:
        SetInt32(this,option_field->number_,(int32_t)uVar9,type,unknown_fields);
        goto LAB_00143226;
      }
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
      ;
    }
    break;
  case 2:
    pUVar1 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar1->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar1->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        iVar11 = option_field->number_;
        uVar10 = (pUVar1->field_0)._impl_.negative_int_value_;
LAB_00143129:
        SetInt64(this,iVar11,uVar10,type,unknown_fields);
        goto LAB_00143226;
      }
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__4,std::__cxx11::string>
      ;
    }
    else {
      uVar10 = (pUVar1->field_0)._impl_.positive_int_value_;
      if (-1 < (long)uVar10) {
        iVar11 = option_field->number_;
        goto LAB_00143129;
      }
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__3,std::__cxx11::string>
      ;
    }
    break;
  case 3:
    if ((undefined1  [80])
        ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x8) ==
        (undefined1  [80])0x0) {
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__6,std::__cxx11::string>
      ;
    }
    else {
      uVar9 = (this->uninterpreted_option_->field_0)._impl_.positive_int_value_;
      if (uVar9 >> 0x20 == 0) {
        SetUInt32(this,option_field->number_,(uint32_t)uVar9,type,unknown_fields);
        goto LAB_00143226;
      }
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__5,std::__cxx11::string>
      ;
    }
    break;
  case 4:
    if ((undefined1  [80])
        ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x8) !=
        (undefined1  [80])0x0) {
      SetUInt64(this,option_field->number_,
                (this->uninterpreted_option_->field_0)._impl_.positive_int_value_,type,
                unknown_fields);
      goto LAB_00143226;
    }
    pcVar8 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,std::__cxx11::string>
    ;
    break;
  case 5:
    pUVar1 = this->uninterpreted_option_;
    aVar3 = pUVar1->field_0;
    if (((undefined1  [80])aVar3 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar3 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar3 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((ulong)(pUVar1->field_0)._impl_.identifier_value_.tagged_ptr_.
                                             ptr_ & 0xfffffffffffffffc),"inf");
          if (bVar4) {
            value = INFINITY;
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc),"nan");
            if (!bVar4) {
              pcVar8 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__9,std::__cxx11::string>
              ;
              break;
            }
            value = NAN;
          }
        }
        else {
          value = (double)(pUVar1->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar10 = (pUVar1->field_0)._impl_.positive_int_value_;
        value = ((double)CONCAT44(0x45300000,(int)(uVar10 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      }
    }
    else {
      value = (pUVar1->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed64(unknown_fields,option_field->number_,(uint64_t)value);
    goto LAB_00143226;
  case 6:
    pUVar1 = this->uninterpreted_option_;
    aVar3 = pUVar1->field_0;
    if (((undefined1  [80])aVar3 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar3 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar3 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((ulong)(pUVar1->field_0)._impl_.identifier_value_.tagged_ptr_.
                                             ptr_ & 0xfffffffffffffffc),"inf");
          if (bVar4) {
            value_00 = INFINITY;
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc),"nan");
            if (!bVar4) {
              pcVar8 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__8,std::__cxx11::string>
              ;
              break;
            }
            value_00 = NAN;
          }
        }
        else {
          value_00 = (float)(pUVar1->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar9 = (pUVar1->field_0)._impl_.positive_int_value_;
        if ((long)uVar9 < 0) {
          value_00 = (float)uVar9;
        }
        else {
          value_00 = (float)(long)uVar9;
        }
      }
    }
    else {
      value_00 = (float)(pUVar1->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed32(unknown_fields,option_field->number_,(uint32_t)value_00);
    goto LAB_00143226;
  case 7:
    if ((undefined1  [80])
        ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x1) !=
        (undefined1  [80])0x0) {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                      identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                              "true");
      if (bVar4) {
        uVar10 = 1;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                         identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                                "false");
        if (!bVar4) {
          pcVar8 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__11,std::__cxx11::string>
          ;
          break;
        }
        uVar10 = 0;
      }
      iVar11 = option_field->number_;
LAB_0014321e:
      UnknownFieldSet::AddVarint(unknown_fields,iVar11,uVar10);
      goto LAB_00143226;
    }
    pcVar8 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__10,std::__cxx11::string>
    ;
    break;
  case 8:
    if ((undefined1  [80])
        ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x1) ==
        (undefined1  [80])0x0) {
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__12,std::__cxx11::string>
      ;
    }
    else {
      this_00 = FieldDescriptor::enum_type(option_field);
      pcVar12 = (char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.identifier_value_.
                                tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      pDVar2 = this_00->file_->pool_;
      enum_type = this_00;
      pDVar5 = DescriptorPool::generated_pool();
      if (pDVar2 == pDVar5) {
        name_00._M_str = *(char **)pcVar12;
        name_00._M_len = *(size_t *)(pcVar12 + 8);
        SVar6.ptr_ = (SymbolBase *)EnumDescriptor::FindValueByName(this_00,name_00);
      }
      else {
        local_48._M_str = (this_00->all_names_).payload_;
        local_48._M_len = (size_t)*(ushort *)(local_48._M_str + 2);
        local_48._M_str = local_48._M_str + ~local_48._M_len;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&fully_qualified_name,&local_48,&local_71);
        std::__cxx11::string::resize((ulong)&fully_qualified_name);
        std::__cxx11::string::append((string *)&fully_qualified_name);
        name._M_str = fully_qualified_name._M_dataplus._M_p;
        name._M_len = fully_qualified_name._M_string_length;
        SVar6 = FindSymbolNotEnforcingDeps(this->builder_,name,true);
        if ((SVar6.ptr_)->symbol_type_ == '\x05') {
LAB_00142fd0:
          if (((EnumValueDescriptor *)SVar6.ptr_)->type_ == this_00) goto LAB_001431fb;
          local_48._M_len = (size_t)&enum_type;
          local_38 = &option_field_local;
          make_error.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__13,std::__cxx11::string>
          ;
          make_error.ptr_.obj = &local_48;
          local_48._M_str = pcVar12;
          unaff_BPL = AddValueError(this,make_error);
          SVar6.ptr_ = (SymbolBase *)0x0;
          bVar4 = false;
        }
        else {
          if ((SVar6.ptr_)->symbol_type_ == '\x06') {
            SVar6.ptr_ = SVar6.ptr_ + -1;
            goto LAB_00142fd0;
          }
          SVar6.ptr_ = (SymbolBase *)0x0;
LAB_001431fb:
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)&fully_qualified_name);
        if (!bVar4) goto LAB_0014324d;
      }
      if ((EnumValueDescriptor *)SVar6.ptr_ != (EnumValueDescriptor *)0x0) {
        iVar11 = option_field_local->number_;
        uVar10 = (uint64_t)((EnumValueDescriptor *)SVar6.ptr_)->number_;
        goto LAB_0014321e;
      }
      pcVar8 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,std::__cxx11::string>
      ;
      fully_qualified_name._M_string_length = (size_type)pcVar12;
    }
    break;
  case 9:
    if ((undefined1  [80])
        ((undefined1  [80])this->uninterpreted_option_->field_0 & (undefined1  [80])0x2) !=
        (undefined1  [80])0x0) {
      puVar7 = (undefined8 *)
               ((ulong)(this->uninterpreted_option_->field_0)._impl_.string_value_.tagged_ptr_.ptr_
               & 0xfffffffffffffffc);
      value_01._M_str = (char *)*puVar7;
      value_01._M_len = puVar7[1];
      UnknownFieldSet::AddLengthDelimited(unknown_fields,option_field->number_,value_01);
      goto LAB_00143226;
    }
    pcVar8 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__15,std::__cxx11::string>
    ;
    break;
  case 10:
    bVar4 = SetAggregateOption(this,option_field,unknown_fields);
    if (!bVar4) {
      unaff_BPL = 0;
      goto LAB_0014324d;
    }
LAB_00143226:
    unaff_BPL = 1;
    goto LAB_0014324d;
  }
  fully_qualified_name._M_dataplus._M_p = (pointer)&option_field_local;
  make_error_00.ptr_.obj = &fully_qualified_name;
  make_error_00.invoker_ = pcVar8;
  unaff_BPL = AddValueError(this,make_error_00);
LAB_0014324d:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int32_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64_t>(std::numeric_limits<int32_t>::min())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int32_t>("int32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int64_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int64_t>("int64", option_field->full_name());
          });
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int64_t>("int64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            std::numeric_limits<uint32_t>::max()) {
          return AddValueError([&] {
            return ValueOutOfRange<uint32_t>("uint32",
                                             option_field->full_name());
          });
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint32_t>("uint32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint64_t>("uint64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<float>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<float>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for float option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<double>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<double>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for double option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64_t value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat("Value must be identifier for boolean option \"",
                              option_field->full_name(), "\".");
        });
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be \"true\" or \"false\" for boolean option \"",
              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be identifier for enum-valued option \"",
              option_field->full_name(), "\".");
        });
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = std::string(enum_type->full_name());
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (auto* candidate_descriptor = symbol.enum_value_descriptor()) {
          if (candidate_descriptor->type() != enum_type) {
            return AddValueError([&] {
              return absl::StrCat(
                  "Enum type \"", enum_type->full_name(),
                  "\" has no value named \"", value_name, "\" for option \"",
                  option_field->full_name(),
                  "\". This appears to be a value from a sibling type.");
            });
          } else {
            enum_value = candidate_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError([&] {
          return absl::StrCat(
              "Enum type \"", option_field->enum_type()->full_name(),
              "\" has no value named \"", value_name, "\" for option \"",
              option_field->full_name(), "\".");
        });
      } else {
        // Sign-extension is not a problem, since we cast directly from int32_t
        // to uint64_t, without first going through uint32_t.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64_t>(static_cast<int64_t>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be quoted string for string option \"",
              option_field->full_name(), "\".");
        });
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}